

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void reset_state(vw *all,bfgs *b,bool zero)

{
  byte in_DL;
  long in_RSI;
  
  *(undefined4 *)(in_RSI + 0xe4) = 0;
  *(undefined4 *)(in_RSI + 0xe0) = 0;
  *(undefined8 *)(in_RSI + 0xf0) = 0;
  *(undefined8 *)(in_RSI + 0xe8) = 0;
  *(undefined8 *)(in_RSI + 0x100) = 0;
  *(undefined8 *)(in_RSI + 0x108) = 0;
  *(undefined1 *)(in_RSI + 0x110) = 1;
  *(undefined1 *)(in_RSI + 0x111) = 1;
  *(undefined1 *)(in_RSI + 0x112) = 1;
  if ((in_DL & 1) != 0) {
    zero_derivative((vw *)0x23d099);
    zero_preconditioner((vw *)0x23d0a3);
  }
  return;
}

Assistant:

void reset_state(vw& all, bfgs& b, bool zero)
{
  b.lastj = b.origin = 0;
  b.loss_sum = b.previous_loss_sum = 0.;
  b.importance_weight_sum = 0.;
  b.curvature = 0.;
  b.first_pass = true;
  b.gradient_pass = true;
  b.preconditioner_pass = true;
  if (zero)
  {
    zero_derivative(all);
    zero_preconditioner(all);
  }
}